

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

void Bac_ManMoveNames(Bac_Man_t *pNew,Bac_Man_t *p)

{
  int iVar1;
  Bac_Ntk_t *p_00;
  Bac_Ntk_t *pNew_00;
  undefined4 local_24;
  int i;
  Bac_Ntk_t *pNtk;
  Bac_Man_t *p_local;
  Bac_Man_t *pNew_local;
  
  for (local_24 = 1; iVar1 = Bac_ManNtkNum(p), local_24 <= iVar1; local_24 = local_24 + 1) {
    p_00 = Bac_ManNtk(p,local_24);
    pNew_00 = Bac_NtkCopyNtk(pNew,p_00);
    Bac_NtkMoveNames(pNew_00,p_00);
  }
  return;
}

Assistant:

static inline void Bac_ManMoveNames( Bac_Man_t * pNew, Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkMoveNames( Bac_NtkCopyNtk(pNew, pNtk), pNtk );
}